

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleNearest2D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,IVec3 *offset)

{
  int iVar1;
  int iVar2;
  deInt32 dVar3;
  int iVar4;
  deInt32 dVar5;
  int iVar6;
  deBool dVar7;
  TextureFormat *format;
  undefined1 auVar9 [12];
  undefined8 uVar10;
  Vec4 VVar8;
  int j;
  int i;
  int y;
  int x;
  int height;
  int width;
  IVec3 *offset_local;
  float v_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar1 = ConstPixelBufferAccess::getWidth(access);
  iVar2 = ConstPixelBufferAccess::getHeight(access);
  dVar3 = ::deFloorFloatToInt32(u);
  iVar4 = Vector<int,_3>::x(offset);
  dVar5 = ::deFloorFloatToInt32(v);
  iVar6 = Vector<int,_3>::y(offset);
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    dVar7 = deInBounds32(dVar3 + iVar4,0,iVar1);
    if (dVar7 != 0) goto LAB_029231b0;
LAB_029231cc:
    format = ConstPixelBufferAccess::getFormat(access);
    VVar8 = lookupBorder(this,format,sampler);
  }
  else {
LAB_029231b0:
    if (sampler->wrapT == CLAMP_TO_BORDER) {
      dVar7 = deInBounds32(dVar5 + iVar6,0,iVar2);
      if (dVar7 == 0) goto LAB_029231cc;
    }
    iVar1 = wrap(sampler->wrapS,dVar3 + iVar4,iVar1);
    iVar2 = wrap(sampler->wrapT,dVar5 + iVar6,iVar2);
    iVar4 = Vector<int,_3>::z(offset);
    VVar8 = lookup(this,access,iVar1,iVar2,iVar4);
  }
  VVar8.m_data[0] = VVar8.m_data[0];
  auVar9._4_4_ = VVar8.m_data[1];
  register0x00001240 = VVar8.m_data[2];
  register0x00001244 = VVar8.m_data[3];
  return (Vec4)VVar8.m_data;
}

Assistant:

static Vec4 sampleNearest2D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();

	int x = deFloorFloatToInt32(u)+offset.x();
	int y = deFloorFloatToInt32(v)+offset.y();

	// Check for CLAMP_TO_BORDER.
	if ((sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width)) ||
		(sampler.wrapT == Sampler::CLAMP_TO_BORDER && !deInBounds32(y, 0, height)))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);
	int j = wrap(sampler.wrapT, y, height);

	return lookup(access, i, j, offset.z());
}